

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

optional<std::reference_wrapper<Symbol>_> __thiscall
SymbolTable::lookup(SymbolTable *this,string *name,int maxDepth)

{
  _Map_pointer ppuVar1;
  bool bVar2;
  _Storage<std::reference_wrapper<Symbol>,_true> _Var3;
  const_iterator cVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  int iVar6;
  _Elt_pointer puVar7;
  _Map_pointer ppuVar8;
  _Elt_pointer puVar9;
  _Elt_pointer puVar10;
  bool bVar11;
  optional<std::reference_wrapper<Symbol>_> oVar12;
  
  puVar10 = (this->scopes_).
            super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  puVar9 = (this->scopes_).
           super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppuVar8 = (this->scopes_).
            super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar6 = maxDepth + -1;
  while( true ) {
    bVar11 = (this->scopes_).
             super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur < puVar10;
    ppuVar1 = (this->scopes_).
              super__Deque_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    bVar2 = ppuVar1 < ppuVar8;
    if (ppuVar1 == ppuVar8) {
      bVar2 = bVar11;
    }
    if (!bVar2) break;
    puVar7 = puVar10;
    if (puVar10 == puVar9) {
      puVar7 = ppuVar8[-1] + 9;
    }
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&puVar7[-1]._M_h,name);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      _Var3 = *(_Storage<std::reference_wrapper<Symbol>,_true> *)
               ((long)cVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Symbol,_std::default_delete<Symbol>_>_>,_true>
                      ._M_cur + 0x28);
      uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_00144ba3;
    }
    bVar11 = iVar6 != 0;
    iVar6 = iVar6 + -1;
    if ((maxDepth != 0) && (!bVar11)) break;
    if (puVar10 == puVar9) {
      puVar9 = ppuVar8[-1];
      ppuVar8 = ppuVar8 + -1;
      puVar10 = puVar9 + 9;
    }
    puVar10 = puVar10 + -1;
  }
  _Var3._1_7_ = 0;
  _Var3._0_1_ = bVar11;
  uVar5 = 0;
LAB_00144ba3:
  oVar12.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
  super__Optional_payload_base<std::reference_wrapper<Symbol>_>._8_8_ = uVar5;
  oVar12.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
  super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload = _Var3;
  return (optional<std::reference_wrapper<Symbol>_>)
         oVar12.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
         super__Optional_payload_base<std::reference_wrapper<Symbol>_>;
}

Assistant:

std::optional<std::reference_wrapper<Symbol>> SymbolTable::lookup(const std::string& name, int maxDepth) const
{
  int depth = 1;
  for(auto scopesIt = scopes_.crbegin(); scopesIt < scopes_.crend(); ++scopesIt, ++depth)
  {
    auto it = scopesIt->find(name);
    if(it != scopesIt->end())
      return *it->second;

    if(maxDepth != 0 && depth == maxDepth)
      break;
  }

  return {};  
}